

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int ecjpake_kkp_read(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                    mbedtls_ecp_point *X,char *id,uchar **p,uchar *end)

{
  int iVar1;
  int local_3c;
  int ret;
  char *id_local;
  mbedtls_ecp_point *X_local;
  mbedtls_ecp_point *G_local;
  int pf_local;
  mbedtls_ecp_group *grp_local;
  mbedtls_md_type_t md_type_local;
  
  if (end < *p) {
    grp_local._4_4_ = -0x4f80;
  }
  else {
    local_3c = mbedtls_ecp_tls_read_point(grp,X,p,(long)end - (long)*p);
    if (local_3c == 0) {
      iVar1 = mbedtls_ecp_is_zero(X);
      if (iVar1 == 0) {
        local_3c = ecjpake_zkp_read(md_type,grp,pf,G,X,id,p,end);
      }
      else {
        local_3c = -0x4c80;
      }
    }
    grp_local._4_4_ = local_3c;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecjpake_kkp_read(const mbedtls_md_type_t md_type,
                            const mbedtls_ecp_group *grp,
                            const int pf,
                            const mbedtls_ecp_point *G,
                            mbedtls_ecp_point *X,
                            const char *id,
                            const unsigned char **p,
                            const unsigned char *end)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (end < *p) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    /*
     * struct {
     *     ECPoint X;
     *     ECSchnorrZKP zkp;
     * } ECJPAKEKeyKP;
     */
    MBEDTLS_MPI_CHK(mbedtls_ecp_tls_read_point(grp, X, p, end - *p));
    if (mbedtls_ecp_is_zero(X)) {
        ret = MBEDTLS_ERR_ECP_INVALID_KEY;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(ecjpake_zkp_read(md_type, grp, pf, G, X, id, p, end));

cleanup:
    return ret;
}